

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rtreenode(sqlite3_context *ctx,int nArg,sqlite3_value **apArg)

{
  uint uVar1;
  u8 uVar2;
  int iVar3;
  i64 iVar4;
  u8 *puVar5;
  sqlite3_str *p;
  char *z;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  RtreeNode node;
  RtreeCell cell;
  Rtree tree;
  RtreeNode local_458;
  RtreeCell local_428;
  Rtree local_3f8;
  
  local_458.pParent = (RtreeNode *)0x0;
  local_458.iNode = 0;
  local_458.nRef = 0;
  local_458.isDirty = 0;
  local_458.zData = (u8 *)0x0;
  local_458.pNext = (RtreeNode *)0x0;
  memset(&local_3f8,0,0x3c8);
  iVar4 = sqlite3VdbeIntValue(*apArg);
  local_3f8.nDim = (u8)iVar4;
  if (0xfffffffa < ((uint)iVar4 & 0xff) - 6) {
    uVar2 = local_3f8.nDim * '\x02';
    bVar8 = local_3f8.nDim * '\b' + 8;
    local_3f8.nDim2 = uVar2;
    local_3f8.nBytesPerCell = bVar8;
    puVar5 = (u8 *)sqlite3_value_blob(apArg[1]);
    local_458.zData = puVar5;
    iVar3 = sqlite3ValueBytes(apArg[1],'\x01');
    if ((3 < iVar3) &&
       ((int)((uint)bVar8 *
             (uint)(ushort)(*(ushort *)(puVar5 + 2) << 8 | *(ushort *)(puVar5 + 2) >> 8)) <= iVar3))
    {
      p = sqlite3_str_new((sqlite3 *)0x0);
      if ((*(ushort *)(puVar5 + 2) & 0xff) != 0 || *(ushort *)(puVar5 + 2) >> 8 != 0) {
        uVar7 = 0;
        do {
          nodeGetCell(&local_3f8,&local_458,uVar7,&local_428);
          if (uVar7 != 0) {
            uVar1 = p->nChar;
            uVar6 = uVar1 + 1;
            if (uVar6 < p->nAlloc) {
              p->nChar = uVar6;
              p->zText[uVar1] = ' ';
            }
            else {
              enlargeAndAppend(p," ",1);
            }
          }
          sqlite3_str_appendf(p,"{%lld",local_428.iRowid);
          if (uVar2 != '\0') {
            uVar9 = 0;
            do {
              sqlite3_str_appendf(p," %g",SUB84((double)*(float *)((long)local_428.aCoord + uVar9),0
                                               ));
              uVar9 = uVar9 + 4;
            } while (((uint)iVar4 & 0x7f) << 3 != uVar9);
          }
          uVar1 = p->nChar;
          uVar6 = uVar1 + 1;
          if (uVar6 < p->nAlloc) {
            p->nChar = uVar6;
            p->zText[uVar1] = '}';
          }
          else {
            enlargeAndAppend(p,"}",1);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < (ushort)(*(ushort *)(puVar5 + 2) << 8 | *(ushort *)(puVar5 + 2) >> 8));
      }
      if (p == (sqlite3_str *)0x0) {
        uVar7 = 7;
      }
      else {
        uVar7 = (uint)p->accError;
      }
      z = sqlite3_str_finish(p);
      setResultStrOrError(ctx,z,-1,'\x01',sqlite3_free);
      sqlite3_result_error_code(ctx,uVar7);
      return;
    }
  }
  return;
}

Assistant:

static void rtreenode(sqlite3_context *ctx, int nArg, sqlite3_value **apArg){
  RtreeNode node;
  Rtree tree;
  int ii;
  int nData;
  int errCode;
  sqlite3_str *pOut;

  UNUSED_PARAMETER(nArg);
  memset(&node, 0, sizeof(RtreeNode));
  memset(&tree, 0, sizeof(Rtree));
  tree.nDim = (u8)sqlite3_value_int(apArg[0]);
  if( tree.nDim<1 || tree.nDim>5 ) return;
  tree.nDim2 = tree.nDim*2;
  tree.nBytesPerCell = 8 + 8 * tree.nDim;
  node.zData = (u8 *)sqlite3_value_blob(apArg[1]);
  nData = sqlite3_value_bytes(apArg[1]);
  if( nData<4 ) return;
  if( nData<NCELL(&node)*tree.nBytesPerCell ) return;

  pOut = sqlite3_str_new(0);
  for(ii=0; ii<NCELL(&node); ii++){
    RtreeCell cell;
    int jj;

    nodeGetCell(&tree, &node, ii, &cell);
    if( ii>0 ) sqlite3_str_append(pOut, " ", 1);
    sqlite3_str_appendf(pOut, "{%lld", cell.iRowid);
    for(jj=0; jj<tree.nDim2; jj++){
#ifndef SQLITE_RTREE_INT_ONLY
      sqlite3_str_appendf(pOut, " %g", (double)cell.aCoord[jj].f);
#else
      sqlite3_str_appendf(pOut, " %d", cell.aCoord[jj].i);
#endif
    }
    sqlite3_str_append(pOut, "}", 1);
  }
  errCode = sqlite3_str_errcode(pOut);
  sqlite3_result_text(ctx, sqlite3_str_finish(pOut), -1, sqlite3_free);
  sqlite3_result_error_code(ctx, errCode);
}